

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

string * __thiscall
cppcms::session_interface::get_session_cookie_abi_cxx11_(session_interface *this)

{
  bool bVar1;
  cached_settings *pcVar2;
  _data *p_Var3;
  request *this_00;
  long in_RSI;
  session_interface *in_RDI;
  session_interface *unaff_retaddr;
  const_iterator p;
  cookies_type *cookies;
  string *name;
  session_interface *this_01;
  _Self local_30;
  _Self local_28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  *local_20;
  cached_cookies *local_18;
  
  this_01 = in_RDI;
  check(unaff_retaddr);
  pcVar2 = cached_settings(this_01);
  local_18 = &(pcVar2->session).cookies;
  p_Var3 = booster::hold_ptr<cppcms::session_interface::_data>::operator->
                     ((hold_ptr<cppcms::session_interface::_data> *)(in_RSI + 0xb8));
  if (p_Var3->adapter == (session_interface_cookie_adapter *)0x0) {
    this_00 = http::context::request((context *)0x44243e);
    local_20 = http::request::cookies_abi_cxx11_(this_00);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
                 *)this_01,(key_type *)0x44245a);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
                *)this_01);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      std::__cxx11::string::string((string *)this_01);
    }
    else {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
                    *)0x442498);
      http::cookie::value_abi_cxx11_((cookie *)this_01);
    }
  }
  else {
    p_Var3 = booster::hold_ptr<cppcms::session_interface::_data>::operator->
                       ((hold_ptr<cppcms::session_interface::_data> *)(in_RSI + 0xb8));
    (*p_Var3->adapter->_vptr_session_interface_cookie_adapter[3])(this_01,p_Var3->adapter,local_18);
  }
  return (string *)in_RDI;
}

Assistant:

std::string session_interface::get_session_cookie()
{
	check();
	std::string const &name=cached_settings().session.cookies.prefix;
	if(d->adapter) {
		return d->adapter->get_session_cookie(name);
	}
	else {
		http::request::cookies_type const &cookies = context_->request().cookies();
		http::request::cookies_type::const_iterator p=cookies.find(name);
		if(p==cookies.end())
			return std::string();
		return p->second.value();
	}
}